

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall
TC_parser<true>::parserWarning
          (TC_parser<true> *this,char *message,char *begin,char *pos,char *message2)

{
  ostream *poVar1;
  char *local_70 [2];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,message);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,begin,pos);
  poVar1 = std::operator<<(poVar1,local_50[0]);
  poVar1 = std::operator<<(poVar1,message2);
  poVar1 = std::operator<<(poVar1,"in Example #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,": \"");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,this->beginLine,this->endLine);
  poVar1 = std::operator<<(poVar1,local_70[0]);
  poVar1 = std::operator<<(poVar1,"\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

inline void parserWarning(const char* message, char* begin, char* pos, const char* message2)
  {
    cerr << message << std::string(begin, pos - begin).c_str() << message2 << "in Example #"
         << this->p->end_parsed_examples << ": \"" << std::string(this->beginLine, this->endLine).c_str() << "\""
         << endl;
  }